

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_action.hpp
# Opt level: O2

bool __thiscall
cpp_properties::
properties_action<boost::property_tree::properties_parser::properties_actor<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,char>>
::operator()(properties_action<boost::property_tree::properties_parser::properties_actor<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,char>>
             *this,token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>
                   *token)

{
  property_type *ppVar1;
  iterator_range<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  switch((token->
         super_token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
         ).
         super_token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
         .id_) {
  case 0x3f6:
    latin1_to_utf8<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,boost::spirit::classic::file_position_base<std::__cxx11::string>>,char>
              (&local_30,(cpp_properties *)&token->value_,in_RDX);
    ppVar1 = boost::property_tree::properties_parser::
             properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
             ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                         **)this);
    std::__cxx11::string::append((string *)ppVar1);
    break;
  case 0x3f7:
    escape_sequence_to_utf8<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,boost::spirit::classic::file_position_base<std::__cxx11::string>>,char>
              (&local_30,(cpp_properties *)&token->value_,in_RDX);
    ppVar1 = boost::property_tree::properties_parser::
             properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
             ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                         **)this);
    std::__cxx11::string::append((string *)ppVar1);
    break;
  case 0x3f8:
    decode_to_utf8<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,boost::spirit::classic::file_position_base<std::__cxx11::string>>,char>
              (&local_30,(cpp_properties *)&token->value_,in_RDX);
    ppVar1 = boost::property_tree::properties_parser::
             properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
             ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                         **)this);
    std::__cxx11::string::append((string *)ppVar1);
    break;
  default:
    goto switchD_00119ad0_caseD_3f9;
  case 0x3fa:
  case 0x3fb:
  case 0x3fc:
  case 0x403:
  case 0x404:
  case 0x405:
  case 0x40e:
  case 0x40f:
  case 0x410:
    boost::property_tree::properties_parser::
    properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
    ::push_back(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                  **)this);
    return true;
  case 0x400:
  case 0x401:
    boost::property_tree::properties_parser::
    properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
    ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                **)this);
    return true;
  case 0x409:
  case 0x40a:
    latin1_to_utf8<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,boost::spirit::classic::file_position_base<std::__cxx11::string>>,char>
              (&local_30,(cpp_properties *)&token->value_,in_RDX);
    ppVar1 = boost::property_tree::properties_parser::
             properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
             ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                         **)this);
    std::__cxx11::string::append((string *)&ppVar1->second);
    break;
  case 0x40b:
    escape_sequence_to_utf8<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,boost::spirit::classic::file_position_base<std::__cxx11::string>>,char>
              (&local_30,(cpp_properties *)&token->value_,in_RDX);
    ppVar1 = boost::property_tree::properties_parser::
             properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
             ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                         **)this);
    std::__cxx11::string::append((string *)&ppVar1->second);
    break;
  case 0x40c:
    decode_to_utf8<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,boost::spirit::classic::file_position_base<std::__cxx11::string>>,char>
              (&local_30,(cpp_properties *)&token->value_,in_RDX);
    ppVar1 = boost::property_tree::properties_parser::
             properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
             ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                         **)this);
    std::__cxx11::string::append((string *)&ppVar1->second);
  }
  std::__cxx11::string::~string((string *)&local_30);
switchD_00119ad0_caseD_3f9:
  return true;
}

Assistant:

bool operator()(Token const &token) const {
    using namespace token;
    switch (token.id()) {
    case ID_KEY_CHARS:
      actor.current().first += latin1_to_utf8(token.value());
      break;
    case ID_KEY_ESCAPE_CHAR:
      actor.current().first += escape_sequence_to_utf8(token.value());
      break;
    case ID_KEY_UNICODE:
      actor.current().first += decode_to_utf8(token.value());
      break;
    case ID_KEY_CR:
    case ID_KEY_LF:
    case ID_KEY_EOL:
    case ID_SEPARATOR_CR:
    case ID_SEPARATOR_LF:
    case ID_SEPARATOR_EOL:
      actor.push_back();
      break;
    case ID_SEPARATOR_EQUAL:
    case ID_SEPARATOR_COLON:
      // force initialization for useless empty key/value case
      actor.current();
      break;
    case ID_VALUE_SPACES:
    case ID_VALUE_CHARS:
      actor.current().second += latin1_to_utf8(token.value());
      break;
    case ID_VALUE_ESCAPE_CHAR:
      actor.current().second += escape_sequence_to_utf8(token.value());
      break;
    case ID_VALUE_UNICODE:
      actor.current().second += decode_to_utf8(token.value());
      break;
    case ID_VALUE_CR:
    case ID_VALUE_LF:
    case ID_VALUE_EOL:
      actor.push_back();
      break;
    }

    // always continue to tokenize
    return true;
  }